

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * __thiscall
CodeGen::generateRecordType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar3;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  size_t i_1;
  size_t i_2;
  size_t i;
  ulong uVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  string decoratedName;
  ulong uVar2;
  
  iVar1 = (*n->px->_vptr_Node[4])();
  uVar2 = CONCAT44(extraout_var,iVar1);
  types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = (*n->px->_vptr_Node[5])(n->px,uVar5 & 0xffffffff);
    generateType_abi_cxx11_(&decoratedName,this,(NodePtr *)CONCAT44(extraout_var_00,iVar1));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&types,
               &decoratedName);
    std::__cxx11::string::~string((string *)&decoratedName);
  }
  iVar3 = std::
          _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->done)._M_t,n);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->done)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = (*n->px->_vptr_Node[3])();
    std::__cxx11::string::string
              ((string *)&decoratedName,(string *)(CONCAT44(extraout_var_01,iVar1) + 0x20));
    poVar4 = std::operator<<(this->os_,"struct ");
    poVar4 = std::operator<<(poVar4,(string *)&decoratedName);
    std::operator<<(poVar4," {\n");
    if (this->noUnion_ == false) {
      lVar6 = 0;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = (*n->px->_vptr_Node[5])(n->px,uVar5 & 0xffffffff);
        if (*(int *)(*(long *)CONCAT44(extraout_var_09,iVar1) + 8) == 0xc) {
          poVar4 = std::operator<<(this->os_,"    typedef ");
          poVar4 = std::operator<<(poVar4,(string *)
                                          ((long)&((types.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar6));
          poVar4 = std::operator<<(poVar4,' ');
          iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
          poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_10,iVar1));
          std::operator<<(poVar4,"_t;\n");
        }
        lVar6 = lVar6 + 0x20;
      }
    }
    lVar6 = 0;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if (this->noUnion_ == false) {
        iVar1 = (*n->px->_vptr_Node[5])(n->px,uVar5 & 0xffffffff);
        if (*(int *)(*(long *)CONCAT44(extraout_var_02,iVar1) + 8) != 0xc) goto LAB_0015948c;
        poVar4 = std::operator<<(this->os_,"    ");
        iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_03,iVar1));
        std::operator<<(poVar4,"_t");
      }
      else {
LAB_0015948c:
        poVar4 = std::operator<<(this->os_,"    ");
        std::operator<<(poVar4,(string *)
                               ((long)&((types.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar6));
      }
      poVar4 = std::operator<<(this->os_,' ');
      iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_04,iVar1));
      std::operator<<(poVar4,";\n");
      lVar6 = lVar6 + 0x20;
    }
    poVar4 = std::operator<<(this->os_,"    ");
    poVar4 = std::operator<<(poVar4,(string *)&decoratedName);
    std::operator<<(poVar4,"()");
    if (uVar2 != 0) {
      std::operator<<(this->os_," :");
    }
    std::operator<<(this->os_,"\n");
    lVar6 = 0;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      poVar4 = std::operator<<(this->os_,"        ");
      iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_05,iVar1));
      std::operator<<(poVar4,"(");
      if (this->noUnion_ == false) {
        iVar1 = (*n->px->_vptr_Node[5])(n->px,uVar5 & 0xffffffff);
        if (*(int *)(*(long *)CONCAT44(extraout_var_06,iVar1) + 8) != 0xc) goto LAB_001595d6;
        poVar4 = this->os_;
        iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_07,iVar1));
        std::operator<<(poVar4,"_t");
      }
      else {
LAB_001595d6:
        std::operator<<(this->os_,
                        (string *)
                        ((long)&((types.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar6));
      }
      std::operator<<(this->os_,"())");
      if (uVar2 - 1 != uVar5) {
        std::operator<<(this->os_,',');
      }
      std::operator<<(this->os_,"\n");
      lVar6 = lVar6 + 0x20;
    }
    std::operator<<(this->os_,"        { }\n");
    std::operator<<(this->os_,"};\n\n");
    iVar1 = (*n->px->_vptr_Node[3])();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(CONCAT44(extraout_var_08,iVar1) + 0x20));
    std::__cxx11::string::~string((string *)&decoratedName);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&iVar3._M_node[1]._M_left);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&types);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateRecordType(const NodePtr& n)
{
    size_t c = n->leaves();
    vector<string> types;
    for (size_t i = 0; i < c; ++i) {
        types.push_back(generateType(n->leafAt(i)));
    }

    map<NodePtr, string>::const_iterator it = done.find(n);
    if (it != done.end()) {
        return it->second;
    }

    string decoratedName = decorate(n->name());
    os_ << "struct " << decoratedName << " {\n";
    if (! noUnion_) {
        for (size_t i = 0; i < c; ++i) {
            if (n->leafAt(i)->type() == avro::AVRO_UNION) {
                os_ << "    typedef " << types[i]
                    << ' ' << n->nameAt(i) << "_t;\n";
            }
        }
    }
    for (size_t i = 0; i < c; ++i) {
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << "    " << n->nameAt(i) << "_t";
        } else {
            os_ << "    " << types[i];
        }
        os_ << ' ' << n->nameAt(i) << ";\n";
    }

    os_ << "    " << decoratedName << "()";
    if (c > 0) {
        os_ << " :";
    }
    os_ << "\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "        " << n->nameAt(i) << "(";
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << n->nameAt(i) << "_t";
        } else {
            os_ << types[i];
        }
        os_ << "())";
        if (i != (c - 1)) {
            os_ << ',';
        }
        os_ << "\n";
    }
    os_ << "        { }\n";
    os_ << "};\n\n";
    return decorate(n->name());
}